

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>
wabt::MakeUnique<wabt::StructType>(void)

{
  StructType *this;
  __uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true> in_RDI;
  
  this = (StructType *)operator_new(0x68);
  StructType::StructType(this,(string_view)ZEXT816(0));
  *(StructType **)
   in_RDI.super___uniq_ptr_impl<wabt::StructType,_std::default_delete<wabt::StructType>_>._M_t.
   super__Tuple_impl<0UL,_wabt::StructType_*,_std::default_delete<wabt::StructType>_>.
   super__Head_base<0UL,_wabt::StructType_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)
         (tuple<wabt::StructType_*,_std::default_delete<wabt::StructType>_>)
         in_RDI.super___uniq_ptr_impl<wabt::StructType,_std::default_delete<wabt::StructType>_>._M_t
         .super__Tuple_impl<0UL,_wabt::StructType_*,_std::default_delete<wabt::StructType>_>.
         super__Head_base<0UL,_wabt::StructType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}